

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_validate_r
              (pfx_table *pfx_table,pfx_record **reason,uint *reason_len,uint32_t asn,
              lrtr_ip_addr *prefix,uint8_t prefix_len,pfxv_state *result)

{
  uint uVar1;
  lrtr_ip_addr prefix_00;
  _Bool _Var2;
  int iVar3;
  trie_node *root_00;
  pfx_record *ppVar4;
  uint8_t from;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff6c;
  pfx_record *start;
  trie_node *ptStack_70;
  uint r_len_old;
  trie_node *node;
  trie_node *root;
  uint8_t prefix_len_local;
  lrtr_ip_addr *prefix_local;
  uint32_t asn_local;
  uint *reason_len_local;
  pfx_record **reason_local;
  pfx_table *pfx_table_local;
  undefined1 auStack_28 [4];
  uint lvl;
  undefined8 local_20;
  undefined4 local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (pfx_table == (pfx_table *)0x0) {
    lrtr_dbg("PFX: TRYING TO VALIDATE A PREFIX BUT NO TABLE INITIALIZED");
    pfx_table_local._0_4_ = -1;
  }
  else {
    pthread_rwlock_rdlock((pthread_rwlock_t *)&pfx_table->lock);
    root_00 = pfx_table_get_root(pfx_table,prefix->ver);
    if (root_00 == (trie_node *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
      *result = BGP_PFXV_STATE_NOT_FOUND;
      pfx_table_free_reason(reason,reason_len);
      pfx_table_local._0_4_ = 0;
    }
    else {
      pfx_table_local._4_4_ = 0;
      ptStack_70 = trie_lookup(root_00,prefix,prefix_len,(uint *)((long)&pfx_table_local + 4));
      if (ptStack_70 == (trie_node *)0x0) {
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        *result = BGP_PFXV_STATE_NOT_FOUND;
        pfx_table_free_reason(reason,reason_len);
        pfx_table_local._0_4_ = 0;
      }
      else {
        if ((reason_len != (uint *)0x0) && (reason != (pfx_record **)0x0)) {
          *reason_len = *ptStack_70->data;
          ppVar4 = (pfx_record *)lrtr_realloc(*reason,(ulong)*reason_len * 0x28);
          *reason = ppVar4;
          if (*reason == (pfx_record *)0x0) {
            pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
            pfx_table_free_reason(reason,reason_len);
            pfx_table_local._0_4_ = -1;
            goto LAB_00109721;
          }
          iVar3 = pfx_table_node2pfx_record(ptStack_70,*reason,*reason_len);
          if (iVar3 == -1) {
            pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
            pfx_table_free_reason(reason,reason_len);
            pfx_table_local._0_4_ = -1;
            goto LAB_00109721;
          }
        }
        do {
          do {
            _Var2 = pfx_table_elem_matches((node_data *)ptStack_70->data,asn,prefix_len);
            if (((_Var2 ^ 0xffU) & 1) == 0) {
              pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
              *result = BGP_PFXV_STATE_VALID;
              pfx_table_local._0_4_ = 0;
              goto LAB_00109721;
            }
            from = (uint8_t)pfx_table_local._4_4_;
            pfx_table_local._4_4_ = pfx_table_local._4_4_ + 1;
            lrtr_ip_addr_get_bits((lrtr_ip_addr *)auStack_28,prefix,from,'\x01');
            prefix_00.u.addr6.addr[1] = local_18;
            prefix_00._0_8_ = local_20;
            prefix_00.u._8_8_ = in_stack_ffffffffffffff6c;
            _Var2 = lrtr_ip_addr_is_zero(prefix_00);
            if (_Var2) {
              ptStack_70 = trie_lookup(ptStack_70->lchild,prefix,prefix_len,
                                       (uint *)((long)&pfx_table_local + 4));
            }
            else {
              ptStack_70 = trie_lookup(ptStack_70->rchild,prefix,prefix_len,
                                       (uint *)((long)&pfx_table_local + 4));
            }
            if (ptStack_70 == (trie_node *)0x0) {
              pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
              *result = BGP_PFXV_STATE_INVALID;
              pfx_table_local._0_4_ = 0;
              goto LAB_00109721;
            }
          } while ((reason_len == (uint *)0x0) || (reason == (pfx_record **)0x0));
          uVar1 = *reason_len;
          *reason_len = *ptStack_70->data + *reason_len;
          ppVar4 = (pfx_record *)lrtr_realloc(*reason,(ulong)*reason_len * 0x28);
          *reason = ppVar4;
          if (*reason == (pfx_record *)0x0) {
            pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
            pfx_table_free_reason(reason,reason_len);
            pfx_table_local._0_4_ = -1;
            goto LAB_00109721;
          }
          iVar3 = pfx_table_node2pfx_record(ptStack_70,*reason + uVar1,*ptStack_70->data);
        } while (iVar3 != -1);
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        pfx_table_free_reason(reason,reason_len);
        pfx_table_local._0_4_ = -1;
      }
    }
  }
LAB_00109721:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return (int)pfx_table_local;
}

Assistant:

RTRLIB_EXPORT int pfx_table_validate_r(struct pfx_table *pfx_table, struct pfx_record **reason,
				       unsigned int *reason_len, const uint32_t asn, const struct lrtr_ip_addr *prefix,
				       const uint8_t prefix_len, enum pfxv_state *result)
{
	// assert(reason_len == NULL || *reason_len  == 0);
	// assert(reason == NULL || *reason == NULL);

	if (pfx_table == NULL) {
		PFX_DBG1("TRYING TO VALIDATE A PREFIX BUT NO TABLE INITIALIZED");
		return PFX_ERROR;
	}

	pthread_rwlock_rdlock(&(pfx_table->lock));
	struct trie_node *root = pfx_table_get_root(pfx_table, prefix->ver);

	if (!root) {
		pthread_rwlock_unlock(&pfx_table->lock);
		*result = BGP_PFXV_STATE_NOT_FOUND;
		pfx_table_free_reason(reason, reason_len);
		return PFX_SUCCESS;
	}

	unsigned int lvl = 0;
	struct trie_node *node = trie_lookup(root, prefix, prefix_len, &lvl);

	if (!node) {
		pthread_rwlock_unlock(&pfx_table->lock);
		*result = BGP_PFXV_STATE_NOT_FOUND;
		pfx_table_free_reason(reason, reason_len);
		return PFX_SUCCESS;
	}

	if (reason_len && reason) {
		*reason_len = ((struct node_data *)node->data)->len;
		*reason = lrtr_realloc(*reason, *reason_len * sizeof(struct pfx_record));
		if (!*reason) {
			pthread_rwlock_unlock(&pfx_table->lock);
			pfx_table_free_reason(reason, reason_len);
			return PFX_ERROR;
		}
		if (pfx_table_node2pfx_record(node, *reason, *reason_len) == PFX_ERROR) {
			pthread_rwlock_unlock(&pfx_table->lock);
			pfx_table_free_reason(reason, reason_len);
			return PFX_ERROR;
		}
	}

	while (!pfx_table_elem_matches(node->data, asn, prefix_len)) {
		if (lrtr_ip_addr_is_zero(lrtr_ip_addr_get_bits(
			    prefix, lvl++,
			    1))) //post-incr lvl, trie_lookup is performed on child_nodes => parent lvl + 1
			node = trie_lookup(node->lchild, prefix, prefix_len, &lvl);
		else
			node = trie_lookup(node->rchild, prefix, prefix_len, &lvl);

		if (!node) {
			pthread_rwlock_unlock(&pfx_table->lock);
			*result = BGP_PFXV_STATE_INVALID;
			return PFX_SUCCESS;
		}

		if (reason_len && reason) {
			unsigned int r_len_old = *reason_len;
			*reason_len += ((struct node_data *)node->data)->len;
			*reason = lrtr_realloc(*reason, *reason_len * sizeof(struct pfx_record));
			struct pfx_record *start = *reason + r_len_old;

			if (!*reason) {
				pthread_rwlock_unlock(&pfx_table->lock);
				pfx_table_free_reason(reason, reason_len);
				return PFX_ERROR;
			}
			if (pfx_table_node2pfx_record(node, start, ((struct node_data *)node->data)->len) ==
			    PFX_ERROR) {
				pthread_rwlock_unlock(&pfx_table->lock);
				pfx_table_free_reason(reason, reason_len);
				return PFX_ERROR;
			}
		}
	}

	pthread_rwlock_unlock(&pfx_table->lock);
	*result = BGP_PFXV_STATE_VALID;
	return PFX_SUCCESS;
}